

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::
SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>::
emplace_back<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
          (SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
           *this,unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                 *args)

{
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  *in_RDI;
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  *in_stack_00000030;
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
  *in_stack_ffffffffffffffd8;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
    ::end(in_RDI);
    local_8 = emplaceRealloc<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
    ::end(in_RDI);
    std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::unique_ptr
              ((unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
               in_RDI,in_stack_ffffffffffffffd8);
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
              ::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }